

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-keyconv.cpp
# Opt level: O2

void free_key_material(key_material_t *pkey)

{
  long lVar1;
  
  if (pkey != (key_material_t *)0x0) {
    for (lVar1 = 8; lVar1 != 0x128; lVar1 = lVar1 + 0x10) {
      free(*(void **)((long)&pkey->size + lVar1));
    }
  }
  return;
}

Assistant:

void free_key_material(key_material_t* pkey)
{
	int i;

	if (!pkey)
	{
		return;
	}

	for (i = 0; i < TAG_MAX; i++)
	{
		if (pkey[i].big)
		{
			free(pkey[i].big);
		}
	}
}